

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

StreamExpressionSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *this,size_t index)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  StreamExpressionSyntax *pSVar2;
  
  if (index * 2 < (this->elements).size_) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         ((this->elements).data_ + index * 2));
    pSVar2 = SyntaxNode::as<slang::syntax::StreamExpressionSyntax>(*ppSVar1);
    return pSVar2;
  }
  std::terminate();
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }